

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

void __thiscall libtorrent::aux::torrent::rename_file(torrent *this,file_index_t index,string *name)

{
  uint uVar1;
  _func_int **pp_Var2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_ac;
  _Head_base<0UL,_libtorrent::aux::hash_picker_*,_false> local_a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_a0 [2];
  undefined1 local_90 [32];
  _Function_base local_70;
  string local_50 [32];
  
  pp_Var2 = (((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger;
  local_ac.m_val = index.m_val;
  if ((this->m_storage).m_disk_io == (disk_interface *)0x0) {
    iVar3 = (*pp_Var2[5])();
    if ((*(uint *)(CONCAT44(extraout_var_00,iVar3) + 0x68) & 8) != 0) {
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_90);
      local_a8._M_head_impl._0_4_ = 0x12;
      alert_manager::
      emplace_alert<libtorrent::file_rename_failed_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>const&,libtorrent::errors::error_code_enum>
                ((alert_manager *)CONCAT44(extraout_var_01,iVar3),(torrent_handle *)local_90,
                 &local_ac,(error_code_enum *)&local_a8);
      ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
                ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 8));
    }
  }
  else {
    iVar3 = (*pp_Var2[4])();
    uVar1 = (this->m_storage).m_idx.m_val;
    ::std::__cxx11::string::string(local_50,(string *)name);
    ::std::__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<libtorrent::aux::torrent,void>
              ((__shared_ptr<libtorrent::aux::torrent,(__gnu_cxx::_Lock_policy)2> *)&local_a8,
               (__weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> *)
               &this->super_enable_shared_from_this<libtorrent::aux::torrent>);
    local_90._0_8_ = on_file_renamed;
    local_90._8_8_ =
         (__uniq_ptr_impl<libtorrent::aux::piece_picker,_std::default_delete<libtorrent::aux::piece_picker>_>
          )0x0;
    local_90._16_8_ = local_a8._M_head_impl;
    local_90._24_8_ = a_Stack_a0[0]._M_pi;
    local_a8._M_head_impl = (hash_picker *)0x0;
    a_Stack_a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    function<void(std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error_const&)>
    ::
    function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>))(std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error_const&)>,void>
              ((function<void(std::__cxx11::string_const&,libtorrent::aux::strong_typedef<int,libtorrent::aux::file_index_tag,void>,libtorrent::storage_error_const&)>
                *)(local_90 + 0x20),
               (_Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_const_libtorrent::storage_error_&)>
                *)local_90);
    (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x50))
              ((long *)CONCAT44(extraout_var,iVar3),uVar1,index.m_val,local_50,local_90 + 0x20);
    ::std::_Function_base::~_Function_base((_Function_base *)(local_90 + 0x20));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_90 + 0x18));
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_a0);
    ::std::__cxx11::string::~string(local_50);
    (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f])
              ();
  }
  return;
}

Assistant:

void torrent::rename_file(file_index_t const index, std::string name)
	{
		INVARIANT_CHECK;

		file_storage const& fs = m_torrent_file->files();
		TORRENT_ASSERT(index >= file_index_t(0));
		TORRENT_ASSERT(index < fs.end_file());
		TORRENT_UNUSED(fs);

		// storage may be nullptr during shutdown
		if (!m_storage)
		{
			if (alerts().should_post<file_rename_failed_alert>())
				alerts().emplace_alert<file_rename_failed_alert>(get_handle()
					, index, errors::session_is_closing);
			return;
		}

		m_ses.disk_thread().async_rename_file(m_storage, index, std::move(name)
			, std::bind(&torrent::on_file_renamed, shared_from_this(), _1, _2, _3));
		m_ses.deferred_submit_jobs();
	}